

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_emit_block_mapping_value(yaml_emitter_t *emitter,yaml_event_t *event,int simple)

{
  yaml_emitter_state_t **top;
  int iVar1;
  yaml_emitter_state_t *pyVar2;
  
  if (simple == 0) {
    iVar1 = yaml_emitter_write_indent(emitter);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
  }
  iVar1 = yaml_emitter_write_indicator(emitter,":",iVar1,0,iVar1);
  if (iVar1 == 0) {
    return 0;
  }
  pyVar2 = (emitter->states).top;
  if (pyVar2 == (emitter->states).end) {
    top = &(emitter->states).top;
    iVar1 = yaml_stack_extend(&(emitter->states).start,top,&(emitter->states).end);
    if (iVar1 == 0) {
      emitter->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar2 = *top;
  }
  (emitter->states).top = pyVar2 + 1;
  *pyVar2 = YAML_EMIT_BLOCK_MAPPING_KEY_STATE;
  iVar1 = yaml_emitter_emit_node(emitter,event,0,0,1,0);
  return iVar1;
}

Assistant:

static int
yaml_emitter_emit_block_mapping_value(yaml_emitter_t *emitter,
        yaml_event_t *event, int simple)
{
    if (simple) {
        if (!yaml_emitter_write_indicator(emitter, ":", 0, 0, 0))
            return 0;
    }
    else {
        if (!yaml_emitter_write_indent(emitter))
            return 0;
        if (!yaml_emitter_write_indicator(emitter, ":", 1, 0, 1))
            return 0;
    }
    if (!PUSH(emitter, emitter->states,
                YAML_EMIT_BLOCK_MAPPING_KEY_STATE))
        return 0;

    return yaml_emitter_emit_node(emitter, event, 0, 0, 1, 0);
}